

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O3

void pem_aes_decrypt(uchar *aes_iv,uint keylen,uchar *buf,size_t buflen,uchar *pwd,size_t pwdlen)

{
  ulong uVar1;
  uchar aes_key [32];
  mbedtls_aes_context aes_ctx;
  uchar local_178 [40];
  mbedtls_aes_context local_150;
  
  mbedtls_aes_init(&local_150);
  pem_pbkdf1(local_178,(ulong)keylen,aes_iv,pwd,pwdlen);
  mbedtls_aes_setkey_dec(&local_150,local_178,keylen * 8);
  mbedtls_aes_crypt_cbc(&local_150,0,buflen,aes_iv,buf,buf);
  mbedtls_aes_free(&local_150);
  if (keylen != 0) {
    uVar1 = 0;
    do {
      local_178[uVar1] = '\0';
      uVar1 = uVar1 + 1;
    } while (keylen != uVar1);
  }
  return;
}

Assistant:

static void pem_aes_decrypt( unsigned char aes_iv[16], unsigned int keylen,
                               unsigned char *buf, size_t buflen,
                               const unsigned char *pwd, size_t pwdlen )
{
    mbedtls_aes_context aes_ctx;
    unsigned char aes_key[32];

    mbedtls_aes_init( &aes_ctx );

    pem_pbkdf1( aes_key, keylen, aes_iv, pwd, pwdlen );

    mbedtls_aes_setkey_dec( &aes_ctx, aes_key, keylen * 8 );
    mbedtls_aes_crypt_cbc( &aes_ctx, MBEDTLS_AES_DECRYPT, buflen,
                     aes_iv, buf, buf );

    mbedtls_aes_free( &aes_ctx );
    mbedtls_zeroize( aes_key, keylen );
}